

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

void __thiscall Assimp::ArmaturePopulate::Execute(ArmaturePopulate *this,aiScene *out)

{
  long lVar1;
  uint __line;
  Logger *pLVar2;
  aiNode *paVar3;
  _Base_ptr p_Var4;
  aiNode *paVar5;
  char *__assertion;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  char *local_1f8 [4];
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  bone_stack;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bone_stack._M_t._M_impl.super__Rb_tree_header._M_header;
  bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bone_stack._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  BuildBoneList(out->mRootNode,out->mRootNode,out,&bones);
  paVar5 = out->mRootNode;
  BuildNodeList(paVar5,&nodes);
  BuildBoneStack(paVar5,out->mRootNode,out,&bones,&bone_stack,&nodes);
  pLVar2 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>(&local_1a8,(char (*) [18])"Bone stack size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar2,local_1f8[0]);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  p_Var4 = bone_stack._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &bone_stack._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<aiBone_*,_std::pair<aiBone_*const,_aiNode_*>,_std::_Select1st<std::pair<aiBone_*const,_aiNode_*>_>,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
      ::~_Rb_tree(&bone_stack._M_t);
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                (&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      std::_Vector_base<aiBone_*,_std::allocator<aiBone_*>_>::~_Vector_base
                (&bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>);
      return;
    }
    lVar1 = *(long *)(p_Var4 + 1);
    paVar5 = (aiNode *)p_Var4[1]._M_parent;
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[21]>(&local_1a8,(char (*) [21])"active node lookup: ");
    std::operator<<((ostream *)&local_1a8,(char *)(lVar1 + 4));
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar2,local_1f8[0]);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    paVar3 = GetArmatureRoot(paVar5,&bones);
    if (paVar3 == (aiNode *)0x0) break;
    *(aiNode **)(lVar1 + 0x408) = paVar3;
    if (paVar5 == (aiNode *)0x0) {
      __assertion = "bone_node";
      __line = 0x60;
      goto LAB_003c1e29;
    }
    *(aiNode **)(lVar1 + 0x410) = paVar5;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  __assertion = "armature";
  __line = 0x5a;
LAB_003c1e29:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                ,__line,"virtual void Assimp::ArmaturePopulate::Execute(aiScene *)");
}

Assistant:

void ArmaturePopulate::Execute(aiScene *out) {

  // Now convert all bone positions to the correct mOffsetMatrix
  std::vector<aiBone *> bones;
  std::vector<aiNode *> nodes;
  std::map<aiBone *, aiNode *> bone_stack;
  BuildBoneList(out->mRootNode, out->mRootNode, out, bones);
  BuildNodeList(out->mRootNode, nodes);

  BuildBoneStack(out->mRootNode, out->mRootNode, out, bones, bone_stack, nodes);

  ASSIMP_LOG_DEBUG_F("Bone stack size: ", bone_stack.size());

  for (std::pair<aiBone *, aiNode *> kvp : bone_stack) {
    aiBone *bone = kvp.first;
    aiNode *bone_node = kvp.second;
    ASSIMP_LOG_DEBUG_F("active node lookup: ", bone->mName.C_Str());
    // lcl transform grab - done in generate_nodes :)

    // bone->mOffsetMatrix = bone_node->mTransformation;
    aiNode *armature = GetArmatureRoot(bone_node, bones);

    ai_assert(armature);

    // set up bone armature id
    bone->mArmature = armature;

    // set this bone node to be referenced properly
    ai_assert(bone_node);
    bone->mNode = bone_node;
  }
}